

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash-c.c
# Opt level: O0

uint128_c_t farmhash128_cc_city_with_seed(char *s,size_t len,uint128_c_t seed)

{
  uint128_c_t seed_00;
  uint128_c_t x_00;
  uint64_t uVar1;
  uint64_t uVar2;
  char *s_00;
  uint64_t uVar3;
  long lVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t in_RCX;
  uint64_t in_RDX;
  ulong in_RSI;
  char *in_RDI;
  char *p;
  uint128_c_t uVar7;
  size_t tail_done;
  uint64_t z;
  uint64_t y;
  uint64_t x;
  uint128_c_t w;
  uint128_c_t v;
  uint64_t in_stack_fffffffffffffec0;
  size_t in_stack_fffffffffffffef8;
  char *in_stack_ffffffffffffff00;
  uint64_t in_stack_ffffffffffffff08;
  uint64_t in_stack_ffffffffffffff10;
  uint64_t local_c0;
  uint64_t local_b8;
  uint64_t local_b0;
  uint64_t local_a8;
  uint64_t local_a0;
  uint64_t local_98;
  uint64_t local_90;
  uint64_t local_88;
  uint64_t local_80;
  uint64_t local_78;
  ulong local_70;
  uint64_t local_68;
  uint64_t local_60;
  uint64_t local_58;
  uint64_t local_50;
  uint64_t local_48;
  uint64_t local_40;
  uint64_t local_38;
  ulong local_30;
  char *local_28;
  uint64_t local_20;
  uint64_t local_18;
  uint128_c_t local_10;
  
  if (in_RSI < 0x80) {
    seed_00.b = in_stack_ffffffffffffff10;
    seed_00.a = in_stack_ffffffffffffff08;
    local_10 = farmhash_cc_city_murmur(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,seed_00);
  }
  else {
    uVar7.b = in_RCX;
    uVar7.a = in_RDX;
    local_30 = in_RSI;
    local_28 = in_RDI;
    local_20 = in_RDX;
    local_18 = in_RCX;
    local_58 = uint128_c_t_low64(uVar7);
    x_00.b = local_18;
    x_00.a = local_20;
    local_60 = uint128_c_t_high64(x_00);
    local_68 = local_30 * -0x4b6d499041670d8d;
    uVar1 = ror64(local_60 ^ 0xb492b66fbe98f273,0x31);
    local_40 = fetch64(local_28);
    local_40 = uVar1 * -0x4b6d499041670d8d + local_40;
    uVar1 = ror64(local_40,0x2a);
    local_38 = fetch64(local_28 + 8);
    local_38 = uVar1 * -0x4b6d499041670d8d + local_38;
    uVar2 = ror64(local_60 + local_68,0x23);
    uVar1 = local_58;
    local_50 = uVar2 * -0x4b6d499041670d8d + local_58;
    uVar2 = fetch64(local_28 + 0x58);
    local_48 = ror64(uVar1 + uVar2,0x35);
    local_48 = local_48 * -0x4b6d499041670d8d;
    do {
      uVar2 = local_58 + local_60 + local_40;
      uVar1 = fetch64(local_28 + 8);
      local_58 = ror64(uVar2 + uVar1,0x25);
      local_58 = local_58 * -0x4b6d499041670d8d;
      s_00 = (char *)(local_60 + local_38);
      uVar1 = fetch64(local_28 + 0x30);
      local_60 = ror64((uint64_t)(s_00 + uVar1),0x2a);
      uVar1 = local_40;
      local_60 = local_60 * -0x4b6d499041670d8d;
      local_58 = local_48 ^ local_58;
      uVar3 = fetch64(local_28 + 0x28);
      local_60 = uVar1 + uVar3 + local_60;
      local_68 = ror64(local_68 + local_50,0x21);
      local_68 = local_68 * -0x4b6d499041670d8d;
      uVar7 = weak_farmhash_cc_len_32_with_seeds(s_00,uVar2,in_stack_fffffffffffffec0);
      local_80 = uVar7.a;
      local_40 = local_80;
      local_78 = uVar7.b;
      local_38 = local_78;
      fetch64(local_28 + 0x10);
      uVar7 = weak_farmhash_cc_len_32_with_seeds(s_00,uVar2,in_stack_fffffffffffffec0);
      local_90 = uVar7.a;
      local_50 = local_90;
      local_88 = uVar7.b;
      local_48 = local_88;
      swap64(&local_68,&local_58);
      lVar4 = local_58 + local_60 + local_40;
      p = local_28 + 0x48;
      local_28 = local_28 + 0x40;
      uVar1 = fetch64(p);
      local_58 = ror64(lVar4 + uVar1,0x25);
      local_58 = local_58 * -0x4b6d499041670d8d;
      lVar4 = local_60 + local_38;
      uVar1 = fetch64(local_28 + 0x30);
      local_60 = ror64(lVar4 + uVar1,0x2a);
      local_60 = local_60 * -0x4b6d499041670d8d;
      local_58 = local_48 ^ local_58;
      uVar1 = local_40;
      uVar3 = fetch64(local_28 + 0x28);
      local_60 = uVar1 + uVar3 + local_60;
      local_68 = ror64(local_68 + local_50,0x21);
      local_68 = local_68 * -0x4b6d499041670d8d;
      uVar7 = weak_farmhash_cc_len_32_with_seeds(s_00,uVar2,in_stack_fffffffffffffec0);
      local_a0 = uVar7.a;
      local_40 = local_a0;
      local_98 = uVar7.b;
      local_38 = local_98;
      fetch64(local_28 + 0x10);
      uVar7 = weak_farmhash_cc_len_32_with_seeds(s_00,uVar2,in_stack_fffffffffffffec0);
      local_b0 = uVar7.a;
      local_50 = local_b0;
      local_a8 = uVar7.b;
      local_48 = local_a8;
      swap64(&local_68,&local_58);
      local_28 = local_28 + 0x40;
      local_30 = local_30 - 0x80;
    } while (0x7f < local_30);
    uVar1 = ror64(local_40 + local_68,0x31);
    local_58 = uVar1 * -0x3c5a37a36834ced9 + local_58;
    uVar1 = local_60 * -0x3c5a37a36834ced9;
    local_60 = ror64(local_48,0x25);
    local_60 = uVar1 + local_60;
    uVar3 = local_68 * -0x3c5a37a36834ced9;
    local_68 = ror64(local_50,0x1b);
    local_68 = uVar3 + local_68;
    local_50 = local_50 * 9;
    local_70 = 0;
    while (local_40 = local_40 * -0x3c5a37a36834ced9, local_70 < local_30) {
      local_70 = local_70 + 0x20;
      uVar5 = ror64(local_58 + local_60,0x2a);
      local_60 = uVar5 * -0x3c5a37a36834ced9 + local_38;
      uVar6 = fetch64(local_28 + (local_30 - local_70) + 0x10);
      uVar5 = local_48;
      local_50 = uVar6 + local_50;
      local_58 = local_58 * -0x3c5a37a36834ced9 + local_50;
      uVar6 = fetch64(local_28 + (local_30 - local_70));
      local_68 = uVar5 + uVar6 + local_68;
      local_48 = local_40 + local_48;
      uVar7 = weak_farmhash_cc_len_32_with_seeds(s_00,uVar2,uVar3);
      local_c0 = uVar7.a;
      local_b8 = uVar7.b;
      local_38 = local_b8;
      local_40 = local_c0;
    }
    local_58 = farmhash_len_16(uVar3,uVar1);
    local_60 = farmhash_len_16(uVar3,uVar1);
    uVar2 = farmhash_len_16(uVar3,uVar1);
    uVar2 = uVar2 + local_60;
    uVar1 = farmhash_len_16(uVar3,uVar1);
    local_10 = make_uint128_c_t(uVar2,uVar1);
  }
  return local_10;
}

Assistant:

uint128_c_t farmhash128_cc_city_with_seed(const char *s, size_t len, uint128_c_t seed) {
  if (len < 128) {
    return farmhash_cc_city_murmur(s, len, seed);
  }

  // We expect len >= 128 to be the common case.  Keep 56 bytes of state:
  // v, w, x, y, and z.
  uint128_c_t v, w;
  uint64_t x = uint128_c_t_low64(seed);
  uint64_t y = uint128_c_t_high64(seed);
  uint64_t z = len * k1;
  size_t tail_done;

  v.a = ror64(y ^ k1, 49) * k1 + fetch64(s);
  v.b = ror64(v.a, 42) * k1 + fetch64(s + 8);
  w.a = ror64(y + z, 35) * k1 + x;
  w.b = ror64(x + fetch64(s + 88), 53) * k1;

  // This is the same inner loop as cityhash64(), manually unrolled.
  do {
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    x = ror64(x + y + v.a + fetch64(s + 8), 37) * k1;
    y = ror64(y + v.b + fetch64(s + 48), 42) * k1;
    x ^= w.b;
    y += v.a + fetch64(s + 40);
    z = ror64(z + w.a, 33) * k1;
    v = weak_farmhash_cc_len_32_with_seeds(s, v.b * k1, x + w.a);
    w = weak_farmhash_cc_len_32_with_seeds(s + 32, z + w.b, y + fetch64(s + 16));
    swap64(&z, &x);
    s += 64;
    len -= 128;
  } while (likely(len >= 128));
  x += ror64(v.a + z, 49) * k0;
  y = y * k0 + ror64(w.b, 37);
  z = z * k0 + ror64(w.a, 27);
  w.a *= 9;
  v.a *= k0;
  // If 0 < len < 128, hash up to 4 chunks of 32 bytes each from the end of s.
  for (tail_done = 0; tail_done < len; ) {
    tail_done += 32;
    y = ror64(x + y, 42) * k0 + v.b;
    w.a += fetch64(s + len - tail_done + 16);
    x = x * k0 + w.a;
    z += w.b + fetch64(s + len - tail_done);
    w.b += v.a;
    v = weak_farmhash_cc_len_32_with_seeds(s + len - tail_done, v.a + z, v.b);
    v.a *= k0;
  }
  // At this point our 56 bytes of state should contain more than
  // enough information for a strong 128-bit hash.  We use two
  // different 56-byte-to-8-byte hashes to get a 16-byte final result.
  x = farmhash_len_16(x, v.a);
  y = farmhash_len_16(y + z, w.a);
  return make_uint128_c_t(farmhash_len_16(x + v.b, w.b) + y,
                   farmhash_len_16(x + w.b, y + v.b));
}